

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::PerfEvents_Tracepoint::ParseFromArray
          (PerfEvents_Tracepoint *this,void *raw,size_t size)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  long lVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong *puVar8;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong *puVar15;
  uint uVar16;
  ulong *in_R11;
  ulong uVar17;
  ulong *puVar18;
  bool bVar19;
  ulong *local_78;
  ulong local_60;
  Field local_58;
  ulong *local_48;
  ulong *local_40;
  string *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar18 = (ulong *)(size + (long)raw);
  do {
    lVar5 = 7;
    if (raw < puVar18) {
      uVar12 = (ulong)(char)(byte)*raw;
      puVar7 = (ulong *)((long)raw + 1);
      if ((long)uVar12 < 0) {
        bVar1 = (byte)*raw;
        uVar3 = (ulong)(bVar1 & 0x7f);
        bVar9 = false;
        puVar8 = puVar7;
        for (; (uVar12 = uVar3, puVar6 = puVar8, (char)bVar1 < '\0' &&
               (bVar19 = 0x38 < lVar5 - 7U, bVar9 = bVar19 || puVar18 <= puVar8, uVar12 = 0,
               puVar6 = puVar7, !bVar19 && puVar18 > puVar8)); lVar5 = lVar5 + 7) {
          bVar1 = (byte)*puVar8;
          in_R11 = (ulong *)((ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f));
          puVar8 = (ulong *)((long)puVar8 + 1);
          uVar3 = uVar3 | (ulong)in_R11;
        }
        puVar7 = puVar6;
        if (bVar9) {
          puVar7 = (ulong *)raw;
          uVar12 = 0;
        }
        if (puVar7 == (ulong *)raw) goto LAB_00232320;
      }
      uVar10 = (uint)(uVar12 >> 3);
      if ((uVar10 == 0) || (puVar18 <= puVar7)) {
switchD_00232098_caseD_3:
        puVar7 = (ulong *)0x0;
        bVar9 = false;
        uVar12 = 0;
        goto LAB_00232291;
      }
      switch((uint)uVar12 & 7) {
      case 0:
        uVar17 = 0;
        bVar9 = puVar7 >= puVar18;
        if (puVar7 < puVar18) {
          in_R11 = (ulong *)((long)puVar7 + 1);
          uVar3 = (ulong)((byte)*puVar7 & 0x7f);
          uVar11 = uVar3;
          uVar16 = 0;
          if ((char)(byte)*puVar7 < '\0') {
            uVar11 = 0;
            uVar16 = 0;
            lVar5 = 7;
            puVar8 = in_R11;
            do {
              bVar19 = 0x38 < lVar5 - 7U;
              bVar9 = bVar19 || puVar18 <= puVar8;
              if (bVar19 || puVar18 <= puVar8) goto LAB_00232224;
              uVar2 = *puVar8;
              puVar8 = (ulong *)((long)puVar8 + 1);
              uVar3 = uVar3 | (ulong)((byte)uVar2 & 0x7f) << ((byte)lVar5 & 0x3f);
              lVar5 = lVar5 + 7;
            } while ((char)(byte)uVar2 < '\0');
            uVar11 = uVar3 & 0xffffffff;
            in_R11 = puVar8;
            uVar16 = (uint)(uVar3 >> 0x20);
          }
        }
        else {
          uVar11 = 0;
          uVar16 = 0;
        }
LAB_00232224:
        uVar3 = (ulong)uVar16;
        if (bVar9) {
          in_R11 = puVar7;
          uVar3 = uVar17;
          uVar11 = uVar17;
        }
        local_78 = puVar7;
        local_48 = (ulong *)raw;
        if (in_R11 != puVar7) goto LAB_0023224c;
        bVar9 = false;
        goto LAB_0023221d;
      case 1:
        in_R11 = puVar7 + 1;
        if (puVar18 < in_R11) {
LAB_00232216:
          bVar9 = false;
          goto LAB_0023221d;
        }
        uVar11 = *puVar7;
        uVar3 = uVar11 >> 0x20;
        break;
      case 2:
        bVar9 = puVar7 >= puVar18;
        uVar3 = local_60;
        if (puVar7 < puVar18) {
          puVar8 = (ulong *)((long)puVar7 + 1);
          uVar11 = (ulong)((byte)*puVar7 & 0x7f);
          in_R11 = puVar8;
          uVar3 = uVar11;
          if ((char)(byte)*puVar7 < '\0') {
            lVar5 = 7;
            puVar6 = puVar8;
            do {
              bVar9 = 0x38 < lVar5 - 7U || puVar18 <= puVar6;
              in_R11 = puVar8;
              uVar3 = local_60;
              if (bVar9) break;
              uVar17 = *puVar6;
              puVar6 = (ulong *)((long)puVar6 + 1);
              uVar11 = uVar11 | (ulong)((byte)uVar17 & 0x7f) << ((byte)lVar5 & 0x3f);
              lVar5 = lVar5 + 7;
              in_R11 = puVar6;
              uVar3 = uVar11;
            } while ((char)(byte)uVar17 < '\0');
          }
        }
        local_60 = uVar3;
        if (bVar9) {
          in_R11 = puVar7;
          local_60 = 0;
        }
        if ((in_R11 == puVar7) || ((ulong)((long)puVar18 - (long)in_R11) < local_60)) {
          uVar3 = 0;
          uVar11 = 0;
          bVar9 = false;
          uVar17 = 0;
        }
        else {
          uVar3 = (ulong)in_R11 >> 0x20;
          uVar11 = (ulong)in_R11 & 0xffffffff;
          in_R11 = (ulong *)((long)in_R11 + local_60);
          bVar9 = true;
          uVar17 = local_60;
        }
        local_78 = puVar7;
        if (!bVar9) goto LAB_00232216;
        goto LAB_0023224c;
      default:
        goto switchD_00232098_caseD_3;
      case 5:
        in_R11 = (ulong *)((long)puVar7 + 4);
        uVar3 = 0;
        if (puVar18 < in_R11) goto LAB_00232320;
        uVar11 = (ulong)(uint)*puVar7;
      }
      uVar17 = 0;
LAB_0023224c:
      bVar9 = true;
      raw = in_R11;
      if (uVar10 < 0x10000) {
        bVar9 = 0xfffffff < uVar17;
        if (bVar9) {
          puVar7 = (ulong *)0x0;
          uVar12 = 0;
        }
        else {
          puVar7 = (ulong *)(uVar11 & 0xffffffff | uVar3 << 0x20);
          uVar12 = uVar17 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        }
      }
      else {
LAB_0023221d:
        puVar7 = (ulong *)0x0;
        uVar12 = 0;
      }
    }
    else {
LAB_00232320:
      puVar7 = (ulong *)0x0;
      uVar12 = 0;
      bVar9 = false;
    }
LAB_00232291:
    if (!bVar9) {
      local_58.size_ = (uint32_t)uVar12;
      local_58.type_ = (uint8_t)(uVar12 >> 0x30);
      local_58.id_ = (uint16_t)(uVar12 >> 0x20);
      if (local_58.id_ != 0) {
        local_38 = &this->name_;
        local_58.int_value_ = (uint64_t)puVar7;
        do {
          uVar4 = (ushort)(uVar12 >> 0x20);
          if (uVar4 < 3) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar12 >> 0x20) & 0x3f);
          }
          if (uVar4 == 2) {
            protozero::Field::get(&local_58,&this->filter_);
          }
          else if (((uint)(uVar12 >> 0x20) & 0xffff) == 1) {
            protozero::Field::get(&local_58,local_38);
          }
          else {
            protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                      (&local_58,&this->unknown_fields_);
          }
          do {
            if (puVar18 <= raw) goto LAB_00232469;
            uVar12 = (ulong)(char)(byte)*raw;
            puVar8 = (ulong *)((long)raw + 1);
            if ((long)uVar12 < 0) {
              uVar3 = (ulong)((byte)*raw & 0x7f);
              bVar9 = false;
              uVar12 = uVar3;
              puVar6 = puVar8;
              if ((char)(byte)*raw < '\0') {
                lVar5 = 7;
                puVar13 = puVar8;
                do {
                  bVar9 = 0x38 < lVar5 - 7U || puVar18 <= puVar13;
                  uVar12 = 0;
                  puVar6 = puVar8;
                  if (bVar9) break;
                  uVar11 = *puVar13;
                  puVar13 = (ulong *)((long)puVar13 + 1);
                  uVar3 = uVar3 | (ulong)((byte)uVar11 & 0x7f) << ((byte)lVar5 & 0x3f);
                  lVar5 = lVar5 + 7;
                  uVar12 = uVar3;
                  puVar6 = puVar13;
                } while ((char)(byte)uVar11 < '\0');
              }
              puVar8 = puVar6;
              if (bVar9) {
                puVar8 = (ulong *)raw;
                uVar12 = 0;
              }
              if (puVar8 == (ulong *)raw) goto LAB_00232469;
            }
            uVar10 = (uint)(uVar12 >> 3);
            if ((uVar10 == 0) || (puVar18 <= puVar8)) {
switchD_002324fa_caseD_3:
              local_58.int_value_ = 0;
              bVar9 = false;
              uVar12 = 0;
              goto LAB_00232736;
            }
            switch((uint)uVar12 & 7) {
            case 0:
              local_58.int_value_ = 0;
              bVar9 = puVar8 >= puVar18;
              if (puVar8 < puVar18) {
                puVar6 = (ulong *)((long)puVar8 + 1);
                uVar16 = (byte)*puVar8 & 0x7f;
                uVar3 = (ulong)uVar16;
                puVar13 = (ulong *)(ulong)uVar16;
                puVar7 = puVar6;
                uVar16 = 0;
                if ((char)(byte)*puVar8 < '\0') {
                  puVar13 = (ulong *)0x0;
                  lVar5 = 7;
                  puVar15 = puVar6;
                  do {
                    bVar19 = 0x38 < lVar5 - 7U;
                    bVar9 = bVar19 || puVar18 <= puVar15;
                    puVar7 = puVar6;
                    uVar16 = 0;
                    if (bVar19 || puVar18 <= puVar15) break;
                    bVar1 = (byte)*puVar15;
                    puVar15 = (ulong *)((long)puVar15 + 1);
                    uVar3 = uVar3 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
                    lVar5 = lVar5 + 7;
                    if (-1 < (char)bVar1) {
                      puVar13 = (ulong *)(uVar3 & 0xffffffff);
                    }
                    puVar7 = puVar15;
                    uVar16 = (uint)(uVar3 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar13 = (ulong *)0x0;
                uVar16 = 0;
              }
              if (bVar9) {
                puVar13 = (ulong *)local_58.int_value_;
              }
              puVar6 = (ulong *)(ulong)uVar16;
              if (bVar9) {
                puVar7 = puVar8;
                puVar6 = (ulong *)local_58.int_value_;
              }
              puVar15 = (ulong *)local_58.int_value_;
              local_48 = (ulong *)raw;
              local_40 = puVar8;
              if (puVar7 == puVar8) {
                uVar12 = 0;
                bVar9 = false;
              }
              else {
LAB_002326eb:
                bVar9 = true;
                raw = puVar7;
                if ((uVar10 < 0x10000) && (puVar15 < (ulong *)0x10000000)) {
                  local_58.int_value_ = (ulong)puVar13 & 0xffffffff | (long)puVar6 << 0x20;
                  uVar12 = (ulong)puVar15 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                  bVar9 = false;
                }
                else {
                  local_58.int_value_ = 0;
                  uVar12 = 0;
                }
              }
              break;
            case 1:
              puVar7 = puVar8 + 1;
              if (puVar7 <= puVar18) {
                puVar13 = (ulong *)*puVar8;
                puVar6 = (ulong *)((ulong)puVar13 >> 0x20);
LAB_00232565:
                puVar15 = (ulong *)0x0;
                goto LAB_002326eb;
              }
              goto LAB_00232469;
            case 2:
              bVar9 = puVar8 >= puVar18;
              puVar6 = local_78;
              if (puVar8 < puVar18) {
                puVar13 = (ulong *)((long)puVar8 + 1);
                puVar15 = (ulong *)(ulong)((byte)*puVar8 & 0x7f);
                puVar7 = puVar13;
                puVar6 = puVar15;
                if ((char)(byte)*puVar8 < '\0') {
                  lVar5 = 7;
                  puVar14 = puVar13;
                  do {
                    bVar9 = 0x38 < lVar5 - 7U || puVar18 <= puVar14;
                    puVar7 = puVar13;
                    puVar6 = local_78;
                    if (bVar9) break;
                    uVar3 = *puVar14;
                    puVar14 = (ulong *)((long)puVar14 + 1);
                    puVar15 = (ulong *)((ulong)puVar15 |
                                       (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar5 & 0x3f));
                    lVar5 = lVar5 + 7;
                    puVar7 = puVar14;
                    puVar6 = puVar15;
                  } while ((char)(byte)uVar3 < '\0');
                }
              }
              local_78 = puVar6;
              puVar13 = (ulong *)0x0;
              if (bVar9) {
                puVar7 = puVar8;
                local_78 = puVar13;
              }
              if (puVar7 == puVar8) {
                puVar6 = (ulong *)0x0;
                bVar9 = false;
                puVar15 = (ulong *)0x0;
              }
              else if ((ulong *)((long)puVar18 - (long)puVar7) < local_78) {
                puVar13 = (ulong *)0x0;
                puVar6 = (ulong *)0x0;
                bVar9 = false;
                puVar15 = (ulong *)0x0;
              }
              else {
                puVar6 = (ulong *)((ulong)puVar7 >> 0x20);
                puVar13 = (ulong *)((ulong)puVar7 & 0xffffffff);
                puVar7 = (ulong *)((long)puVar7 + (long)local_78);
                bVar9 = true;
                puVar15 = local_78;
              }
              if (bVar9) goto LAB_002326eb;
              local_58.int_value_ = 0;
              uVar12 = 0;
              bVar9 = false;
              break;
            default:
              goto switchD_002324fa_caseD_3;
            case 5:
              puVar7 = (ulong *)((long)puVar8 + 4);
              puVar6 = (ulong *)0x0;
              if (puVar7 <= puVar18) {
                puVar13 = (ulong *)(ulong)(uint)*puVar8;
                goto LAB_00232565;
              }
LAB_00232469:
              local_58.int_value_ = 0;
              uVar12 = 0;
              bVar9 = false;
            }
LAB_00232736:
          } while (bVar9);
          local_58.size_ = (uint32_t)uVar12;
          local_58.type_ = (uint8_t)(uVar12 >> 0x30);
          local_58.id_ = (uint16_t)(uVar12 >> 0x20);
        } while (local_58.id_ != 0);
      }
      return puVar18 == (ulong *)raw;
    }
  } while( true );
}

Assistant:

bool PerfEvents_Tracepoint::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* name */:
        field.get(&name_);
        break;
      case 2 /* filter */:
        field.get(&filter_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}